

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t FSE_decompress_wksp_body_bmi2
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize)

{
  FSE_DTable *dt;
  uchar *puVar1;
  uchar *puVar2;
  long lVar3;
  uchar uVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  FSE_DState_t *pFVar11;
  bool bVar12;
  BIT_DStream_t bitD;
  uint maxSymbolValue;
  uint tableLog;
  FSE_DState_t state1;
  FSE_DState_t local_40;
  
  maxSymbolValue = 0xff;
  if (wkspSize < 0x204) {
    sVar6 = 0xffffffffffffffff;
  }
  else {
    sVar5 = FSE_readNCount_bmi2((short *)workSpace,&maxSymbolValue,&tableLog,cSrc,cSrcSize,1);
    sVar6 = sVar5;
    if (sVar5 < 0xffffffffffffff89) {
      sVar6 = 0xffffffffffffffd4;
      if ((tableLog <= maxLog) &&
         (lVar8 = (long)(1 << (tableLog & 0x1f)),
         ((1L << ((ulong)tableLog & 0x3f)) + (ulong)(maxSymbolValue + 1) * 2 + lVar8 * 4 + 0x13 &
         0xfffffffffffffffc) + 0x204 <= wkspSize)) {
        dt = (FSE_DTable *)((long)workSpace + 0x200);
        sVar6 = FSE_buildDTable_internal
                          (dt,(short *)workSpace,maxSymbolValue,tableLog,
                           (void *)(lVar8 * 4 + 0x208 + (long)workSpace),
                           (wkspSize - (lVar8 * 4 + 4)) - 0x204);
        if (sVar6 < 0xffffffffffffff89) {
          puVar2 = (uchar *)((long)dst + (dstCapacity - 3));
          if (*(short *)((long)workSpace + 0x202) == 0) {
            sVar6 = BIT_initDStream(&bitD,(void *)((long)cSrc + sVar5),cSrcSize - sVar5);
            if (sVar6 < 0xffffffffffffff89) {
              FSE_initDState(&state1,&bitD,dt);
              FSE_initDState(&local_40,&bitD,dt);
              lVar8 = 0;
              while (bitD.bitsConsumed < 0x41) {
                if (bitD.ptr < bitD.limitPtr) {
                  if (bitD.ptr == bitD.start) break;
                  bVar12 = bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3);
                  uVar7 = (int)bitD.ptr - (int)bitD.start;
                  if (bVar12) {
                    uVar7 = bitD.bitsConsumed >> 3;
                  }
                  bitD.bitsConsumed = bitD.bitsConsumed + uVar7 * -8;
                }
                else {
                  uVar7 = bitD.bitsConsumed >> 3;
                  bitD.bitsConsumed = bitD.bitsConsumed & 7;
                  bVar12 = true;
                }
                bitD.ptr = bitD.ptr + -(ulong)uVar7;
                puVar1 = (uchar *)((long)dst + lVar8);
                bitD.bitContainer = *(size_t *)bitD.ptr;
                if ((puVar2 <= puVar1) || (!bVar12)) break;
                uVar4 = FSE_decodeSymbol(&state1,&bitD);
                *puVar1 = uVar4;
                uVar4 = FSE_decodeSymbol(&local_40,&bitD);
                puVar1[1] = uVar4;
                uVar4 = FSE_decodeSymbol(&state1,&bitD);
                puVar1[2] = uVar4;
                uVar4 = FSE_decodeSymbol(&local_40,&bitD);
                puVar1[3] = uVar4;
                lVar8 = lVar8 + 4;
              }
              puVar2 = (uchar *)((long)dst + (dstCapacity - 2));
              pFVar11 = &local_40;
              for (; sVar6 = 0xffffffffffffffba, (uchar *)((long)dst + lVar8) <= puVar2;
                  lVar8 = lVar8 + 2) {
                uVar4 = FSE_decodeSymbol(&state1,&bitD);
                *(uchar *)((long)dst + lVar8) = uVar4;
                if (0x40 < bitD.bitsConsumed) {
                  lVar3 = lVar8 + 1;
                  lVar10 = 2;
LAB_0016f08a:
                  uVar4 = FSE_decodeSymbol(pFVar11,&bitD);
                  goto LAB_0016f095;
                }
                if (bitD.ptr < bitD.limitPtr) {
                  if (bitD.ptr != bitD.start) {
                    uVar7 = (int)bitD.ptr - (int)bitD.start;
                    if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
                      uVar7 = bitD.bitsConsumed >> 3;
                    }
                    bitD.bitsConsumed = bitD.bitsConsumed + uVar7 * -8;
                    goto LAB_0016ef74;
                  }
                }
                else {
                  uVar7 = bitD.bitsConsumed >> 3;
                  bitD.bitsConsumed = bitD.bitsConsumed & 7;
LAB_0016ef74:
                  bitD.ptr = bitD.ptr + -(ulong)uVar7;
                  bitD.bitContainer = *(size_t *)bitD.ptr;
                }
                puVar1 = (uchar *)((long)dst + lVar8 + 1);
                if (puVar2 < puVar1) {
                  return 0xffffffffffffffba;
                }
                uVar4 = FSE_decodeSymbol(pFVar11,&bitD);
                *puVar1 = uVar4;
                if (0x40 < bitD.bitsConsumed) {
                  lVar3 = lVar8 + 2;
                  lVar10 = 3;
                  pFVar11 = &state1;
                  goto LAB_0016f08a;
                }
                if (bitD.ptr < bitD.limitPtr) {
                  if (bitD.ptr != bitD.start) {
                    uVar9 = (ulong)(uint)((int)bitD.ptr - (int)bitD.start);
                    if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
                      uVar9 = (ulong)(bitD.bitsConsumed >> 3);
                    }
                    bitD.ptr = bitD.ptr + -uVar9;
                    bitD.bitsConsumed = bitD.bitsConsumed + (int)uVar9 * -8;
                    bitD.bitContainer = *(size_t *)bitD.ptr;
                  }
                }
                else {
                  bitD.ptr = bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3);
                  bitD.bitsConsumed = bitD.bitsConsumed & 7;
                  bitD.bitContainer = *(size_t *)bitD.ptr;
                }
              }
            }
          }
          else {
            sVar6 = BIT_initDStream(&bitD,(void *)((long)cSrc + sVar5),cSrcSize - sVar5);
            if (sVar6 < 0xffffffffffffff89) {
              FSE_initDState(&state1,&bitD,dt);
              FSE_initDState(&local_40,&bitD,dt);
              lVar8 = 0;
              while (bitD.bitsConsumed < 0x41) {
                if (bitD.ptr < bitD.limitPtr) {
                  if (bitD.ptr == bitD.start) break;
                  bVar12 = bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3);
                  uVar7 = (int)bitD.ptr - (int)bitD.start;
                  if (bVar12) {
                    uVar7 = bitD.bitsConsumed >> 3;
                  }
                  bitD.bitsConsumed = bitD.bitsConsumed + uVar7 * -8;
                }
                else {
                  uVar7 = bitD.bitsConsumed >> 3;
                  bitD.bitsConsumed = bitD.bitsConsumed & 7;
                  bVar12 = true;
                }
                bitD.ptr = bitD.ptr + -(ulong)uVar7;
                puVar1 = (uchar *)((long)dst + lVar8);
                bitD.bitContainer = *(size_t *)bitD.ptr;
                if ((puVar2 <= puVar1) || (!bVar12)) break;
                uVar4 = FSE_decodeSymbolFast(&state1,&bitD);
                *puVar1 = uVar4;
                uVar4 = FSE_decodeSymbolFast(&local_40,&bitD);
                puVar1[1] = uVar4;
                uVar4 = FSE_decodeSymbolFast(&state1,&bitD);
                puVar1[2] = uVar4;
                uVar4 = FSE_decodeSymbolFast(&local_40,&bitD);
                puVar1[3] = uVar4;
                lVar8 = lVar8 + 4;
              }
              puVar2 = (uchar *)((long)dst + (dstCapacity - 2));
              pFVar11 = &local_40;
              for (; sVar6 = 0xffffffffffffffba, (uchar *)((long)dst + lVar8) <= puVar2;
                  lVar8 = lVar8 + 2) {
                uVar4 = FSE_decodeSymbolFast(&state1,&bitD);
                *(uchar *)((long)dst + lVar8) = uVar4;
                if (0x40 < bitD.bitsConsumed) {
                  lVar3 = lVar8 + 1;
                  lVar10 = 2;
                  goto LAB_0016f055;
                }
                if (bitD.ptr < bitD.limitPtr) {
                  if (bitD.ptr != bitD.start) {
                    uVar7 = (int)bitD.ptr - (int)bitD.start;
                    if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
                      uVar7 = bitD.bitsConsumed >> 3;
                    }
                    bitD.bitsConsumed = bitD.bitsConsumed + uVar7 * -8;
                    goto LAB_0016ee2a;
                  }
                }
                else {
                  uVar7 = bitD.bitsConsumed >> 3;
                  bitD.bitsConsumed = bitD.bitsConsumed & 7;
LAB_0016ee2a:
                  bitD.ptr = bitD.ptr + -(ulong)uVar7;
                  bitD.bitContainer = *(size_t *)bitD.ptr;
                }
                puVar1 = (uchar *)((long)dst + lVar8 + 1);
                if (puVar2 < puVar1) {
                  return 0xffffffffffffffba;
                }
                uVar4 = FSE_decodeSymbolFast(pFVar11,&bitD);
                *puVar1 = uVar4;
                if (0x40 < bitD.bitsConsumed) {
                  lVar3 = lVar8 + 2;
                  lVar10 = 3;
                  pFVar11 = &state1;
LAB_0016f055:
                  uVar4 = FSE_decodeSymbolFast(pFVar11,&bitD);
LAB_0016f095:
                  *(uchar *)((long)dst + lVar3) = uVar4;
                  return lVar10 + lVar8;
                }
                if (bitD.ptr < bitD.limitPtr) {
                  if (bitD.ptr != bitD.start) {
                    uVar9 = (ulong)(uint)((int)bitD.ptr - (int)bitD.start);
                    if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
                      uVar9 = (ulong)(bitD.bitsConsumed >> 3);
                    }
                    bitD.ptr = bitD.ptr + -uVar9;
                    bitD.bitsConsumed = bitD.bitsConsumed + (int)uVar9 * -8;
                    bitD.bitContainer = *(size_t *)bitD.ptr;
                  }
                }
                else {
                  bitD.ptr = bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3);
                  bitD.bitsConsumed = bitD.bitsConsumed & 7;
                  bitD.bitContainer = *(size_t *)bitD.ptr;
                }
              }
            }
          }
        }
      }
    }
  }
  return sVar6;
}

Assistant:

BMI2_TARGET_ATTRIBUTE static size_t FSE_decompress_wksp_body_bmi2(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize)
{
    return FSE_decompress_wksp_body(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize, 1);
}